

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

ssize_t __thiscall
anon_unknown.dwarf_156c2f::MMIFStream::read(MMIFStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  InputExc *this_00;
  ulong uVar2;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  ulong uVar3;
  ulong __n;
  
  uVar1 = this->_pos;
  uVar2 = this->_length - uVar1;
  if ((int)__buf == 0 || uVar1 <= this->_length && uVar2 != 0) {
    uVar3 = (ulong)(int)__buf;
    __n = uVar3;
    if (uVar2 < uVar3) {
      __n = uVar2;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->_mmapStart + uVar1,__n);
    this->_pos = this->_pos + __n;
    return CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar3 < uVar2) & 0xffffffff;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"Unexpected end of file.");
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

bool
MMIFStream::read (char c[/*n*/], int n)
{
    if (_pos >= _length && n != 0)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    uint64_t n2     = n;
    bool     retVal = true;

    if (_length - _pos <= n2)
    {
        n2     = _length - _pos;
        retVal = false;
    }

    memcpy (c, _mmapStart + _pos, n2);
    _pos += n2;
    return retVal;
}